

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O0

uint32_t __thiscall
spvtools::val::ValidationState_t::GetBitWidth(ValidationState_t *this,uint32_t id)

{
  uint32_t uVar1;
  Op OVar2;
  Instruction *this_00;
  Instruction *inst;
  uint32_t component_type_id;
  uint32_t id_local;
  ValidationState_t *this_local;
  
  uVar1 = GetComponentType(this,id);
  this_00 = FindDef(this,uVar1);
  if (this_00 == (Instruction *)0x0) {
    __assert_fail("inst",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp"
                  ,0x3a0,"uint32_t spvtools::val::ValidationState_t::GetBitWidth(uint32_t) const");
  }
  OVar2 = Instruction::opcode(this_00);
  if ((OVar2 != OpTypeFloat) && (OVar2 = Instruction::opcode(this_00), OVar2 != OpTypeInt)) {
    OVar2 = Instruction::opcode(this_00);
    if (OVar2 == OpTypeBool) {
      return 1;
    }
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp"
                  ,0x3a8,"uint32_t spvtools::val::ValidationState_t::GetBitWidth(uint32_t) const");
  }
  uVar1 = Instruction::word(this_00,2);
  return uVar1;
}

Assistant:

uint32_t ValidationState_t::GetBitWidth(uint32_t id) const {
  const uint32_t component_type_id = GetComponentType(id);
  const Instruction* inst = FindDef(component_type_id);
  assert(inst);

  if (inst->opcode() == spv::Op::OpTypeFloat ||
      inst->opcode() == spv::Op::OpTypeInt)
    return inst->word(2);

  if (inst->opcode() == spv::Op::OpTypeBool) return 1;

  assert(0);
  return 0;
}